

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O3

void __thiscall
cbtConnectivityProcessor::processTriangle
          (cbtConnectivityProcessor *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 uVar1;
  cbtTriangleInfoMap *pcVar2;
  cbtVector3 *pcVar3;
  cbtTriangleInfo *pcVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  cbtScalar *pcVar18;
  int j;
  long lVar19;
  int iVar20;
  uint uVar21;
  cbtVector3 *pcVar22;
  cbtVector3 *pcVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 extraout_var [56];
  undefined1 auVar29 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar30 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar31 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  cbtVector3 cVar63;
  cbtVector3 normalB;
  cbtVector3 normalA;
  cbtTriangleShape tB;
  cbtTriangleShape tA;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  cbtVector3 local_1c8;
  undefined1 local_1b8 [16];
  cbtTriangleInfo *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  cbtVector3 local_188;
  float local_178;
  undefined4 uStack_174;
  undefined8 uStack_170;
  int local_168 [4];
  cbtQuaternion local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  cbtTriangleShape local_130;
  undefined1 local_b0 [4];
  cbtScalar cStack_ac;
  cbtScalar cStack_a8;
  cbtScalar local_a4;
  cbtScalar local_60 [2];
  cbtScalar acStack_58 [2];
  cbtScalar local_50 [2];
  cbtScalar acStack_48 [2];
  cbtScalar local_40 [2];
  cbtScalar acStack_38 [2];
  undefined1 auVar32 [56];
  
  iVar15 = this->m_partIdA;
  uVar21 = this->m_triangleIndexA;
  if (triangleIndex != uVar21 || partId != iVar15) {
    local_168[2] = 0xffffffff;
    local_168[0] = -1;
    local_168[1] = -1;
    local_190 = 0xffffffff;
    local_198 = 0xffffffffffffffff;
    pcVar2 = this->m_triangleInfoMap;
    fVar28 = triangle[1].m_floats[1] - triangle->m_floats[1];
    fVar49 = triangle[1].m_floats[2] - triangle->m_floats[2];
    fVar61 = triangle[2].m_floats[1] - triangle->m_floats[1];
    fVar5 = triangle[1].m_floats[0] - triangle->m_floats[0];
    fVar33 = triangle[2].m_floats[2] - triangle->m_floats[2];
    fVar50 = triangle[2].m_floats[0] - triangle->m_floats[0];
    auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar49)),ZEXT416((uint)fVar28),
                              ZEXT416((uint)fVar33));
    auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * fVar5)),ZEXT416((uint)fVar50),
                              ZEXT416((uint)fVar49));
    auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar50 * fVar28)),ZEXT416((uint)fVar5),
                             ZEXT416((uint)fVar61));
    fVar28 = pcVar2->m_equalVertexThreshold;
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),auVar25,auVar25);
    auVar25 = vfmadd231ss_fma(auVar25,auVar6,auVar6);
    if (fVar28 <= auVar25._0_4_) {
      pcVar3 = this->m_triangleVerticesA;
      fVar49 = pcVar3[1].m_floats[1] - pcVar3->m_floats[1];
      fVar61 = pcVar3[1].m_floats[2] - pcVar3->m_floats[2];
      fVar5 = pcVar3[2].m_floats[1] - pcVar3->m_floats[1];
      fVar33 = pcVar3[1].m_floats[0] - pcVar3->m_floats[0];
      fVar50 = pcVar3[2].m_floats[2] - pcVar3->m_floats[2];
      fVar55 = pcVar3[2].m_floats[0] - pcVar3->m_floats[0];
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar61)),ZEXT416((uint)fVar49),
                                ZEXT416((uint)fVar50));
      auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar50 * fVar33)),ZEXT416((uint)fVar55),
                                ZEXT416((uint)fVar61));
      auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar55 * fVar49)),ZEXT416((uint)fVar33),
                               ZEXT416((uint)fVar5));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),auVar25,auVar25);
      auVar25 = vfmadd231ss_fma(auVar25,auVar6,auVar6);
      if (fVar28 <= auVar25._0_4_) {
        lVar16 = 0;
        iVar17 = 0;
        do {
          lVar19 = 0;
          fVar49 = pcVar3[lVar16].m_floats[0];
          fVar61 = pcVar3[lVar16].m_floats[1];
          fVar5 = pcVar3[lVar16].m_floats[2];
          pcVar18 = triangle->m_floats + 2;
          do {
            fVar33 = fVar61 - pcVar18[-1];
            auVar25 = ZEXT416((uint)(fVar49 - ((cbtVector3 *)(pcVar18 + -2))->m_floats[0]));
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),auVar25,auVar25);
            auVar27 = ZEXT416((uint)(fVar5 - *pcVar18));
            auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
            if (auVar25._0_4_ < fVar28) {
              local_168[iVar17] = (int)lVar16;
              *(int *)((long)&local_198 + (long)iVar17 * 4) = (int)lVar19;
              if (1 < iVar17) {
                return;
              }
              iVar17 = iVar17 + 1;
            }
            lVar19 = lVar19 + 1;
            pcVar18 = pcVar18 + 4;
          } while (lVar19 != 3);
          if (2 < iVar17) {
            return;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        if (iVar17 == 2) {
          iVar17 = local_168[1];
          iVar20 = local_168[0];
          if (local_168[1] == 2 && local_168[0] == 0) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_198;
            iVar20 = 2;
            iVar17 = 0;
            local_168[0] = 2;
            local_168[1] = 0;
            auVar25 = vshufps_avx(auVar25,auVar25,0xe1);
            local_198 = vmovlps_avx(auVar25);
          }
          uVar21 = iVar15 << 0x15 | uVar21;
          local_b0 = (undefined1  [4])uVar21;
          iVar15 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::findIndex
                             (&pcVar2->super_cbtInternalTriangleInfoMap,(cbtHashInt *)local_b0);
          pcVar4 = (pcVar2->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
          local_1b8._0_4_ = iVar20;
          if (pcVar4 == (cbtTriangleInfo *)0x0 || iVar15 == -1) {
            auVar27._8_4_ = 0x40c90fdb;
            auVar27._0_8_ = 0x40c90fdb40c90fdb;
            auVar27._12_4_ = 0x40c90fdb;
            uVar1 = vmovlps_avx(auVar27);
            cStack_ac = (cbtScalar)uVar1;
            cStack_a8 = (cbtScalar)((ulong)uVar1 >> 0x20);
            local_a4 = 6.2831855;
            local_b0 = (undefined1  [4])0x0;
            local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape._0_4_ = uVar21;
            cbtHashMap<cbtHashInt,_cbtTriangleInfo>::insert
                      (&this->m_triangleInfoMap->super_cbtInternalTriangleInfoMap,
                       (cbtHashInt *)&local_130,(cbtTriangleInfo *)local_b0);
            pcVar2 = this->m_triangleInfoMap;
            local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
                 (_func_int **)
                 CONCAT44(local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                          super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape._4_4_
                          ,uVar21);
            iVar15 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::findIndex
                               (&pcVar2->super_cbtInternalTriangleInfoMap,(cbtHashInt *)&local_130);
            iVar20 = local_1b8._0_4_;
            local_1a0 = (cbtTriangleInfo *)0x0;
            if (iVar15 != -1) {
              local_1a0 = (pcVar2->super_cbtInternalTriangleInfoMap).m_valueArray.m_data + iVar15;
            }
          }
          else {
            local_1a0 = pcVar4 + iVar15;
          }
          pcVar3 = this->m_triangleVerticesA;
          local_148 = *(undefined8 *)(pcVar3[iVar20].m_floats + 1);
          fVar33 = pcVar3[iVar17].m_floats[0] - pcVar3[iVar20].m_floats[0];
          local_178 = (float)*(undefined8 *)(pcVar3[iVar17].m_floats + 1);
          uStack_174 = (undefined4)((ulong)*(undefined8 *)(pcVar3[iVar17].m_floats + 1) >> 0x20);
          uStack_170 = 0;
          uStack_140 = 0;
          cbtPolyhedralConvexShape::cbtPolyhedralConvexShape((cbtPolyhedralConvexShape *)local_b0);
          iVar14 = local_198._4_4_;
          lVar16 = (long)local_198._4_4_;
          local_b0 = (undefined1  [4])0xb48678;
          cStack_ac = 0.0;
          cStack_a8 = 1.4013e-45;
          local_60 = *(cbtScalar (*) [2])pcVar3->m_floats;
          acStack_58 = *(cbtScalar (*) [2])(pcVar3->m_floats + 2);
          local_50 = *(cbtScalar (*) [2])pcVar3[1].m_floats;
          acStack_48 = *(cbtScalar (*) [2])(pcVar3[1].m_floats + 2);
          local_40 = *(cbtScalar (*) [2])pcVar3[2].m_floats;
          acStack_38 = *(cbtScalar (*) [2])(pcVar3[2].m_floats + 2);
          iVar15 = (int)local_198;
          lVar19 = (long)(int)local_198;
          cbtPolyhedralConvexShape::cbtPolyhedralConvexShape
                    (&local_130.super_cbtPolyhedralConvexShape);
          local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape
          .super_cbtCollisionShape._vptr_cbtCollisionShape =
               (_func_int **)&PTR__cbtPolyhedralConvexShape_00b48678;
          local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape
          .super_cbtCollisionShape.m_shapeType = 1;
          local_130.m_vertices1[0].m_floats._0_8_ = *(undefined8 *)triangle[lVar16].m_floats;
          local_130.m_vertices1[0].m_floats._8_8_ = *(undefined8 *)(triangle[lVar16].m_floats + 2);
          pcVar23 = triangle + lVar19;
          pcVar22 = triangle + (3 - (iVar14 + iVar15));
          local_130.m_vertices1[1].m_floats._0_8_ = *(undefined8 *)pcVar23->m_floats;
          local_130.m_vertices1[1].m_floats._8_8_ = *(undefined8 *)(pcVar23->m_floats + 2);
          local_130.m_vertices1[2].m_floats._0_8_ = *(undefined8 *)pcVar22->m_floats;
          local_130.m_vertices1[2].m_floats._8_8_ = *(undefined8 *)(pcVar22->m_floats + 2);
          cbtTriangleShape::calcNormal((cbtTriangleShape *)local_b0,&local_188);
          cbtTriangleShape::calcNormal(&local_130,&local_1c8);
          auVar24._4_4_ = uStack_174;
          auVar24._0_4_ = local_178;
          auVar24._8_8_ = uStack_170;
          pcVar3 = this->m_triangleVerticesA;
          auVar26 = ZEXT816(0) << 0x40;
          auVar7._8_8_ = uStack_140;
          auVar7._0_8_ = local_148;
          auVar27 = vsubps_avx(auVar24,auVar7);
          iVar17 = iVar17 + local_1b8._0_4_;
          iVar15 = 3 - iVar17;
          fVar28 = auVar27._0_4_;
          auVar25 = vmovshdup_avx(auVar27);
          auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar33),
                                   ZEXT416((uint)fVar33));
          auVar25 = vfmadd213ss_fma(auVar25,auVar25,auVar6);
          auVar25 = vsqrtss_avx(auVar25,auVar25);
          fVar49 = 1.0 / auVar25._0_4_;
          fVar33 = fVar33 * fVar49;
          auVar52._0_4_ = fVar28 * fVar49;
          auVar52._4_4_ = auVar27._4_4_ * fVar49;
          auVar52._8_4_ = auVar27._8_4_ * fVar49;
          auVar52._12_4_ = auVar27._12_4_ * fVar49;
          auVar44._4_4_ = local_188.m_floats[2];
          auVar44._0_4_ = local_188.m_floats[1];
          auVar44._8_8_ = 0;
          auVar24 = vpermt2ps_avx512vl(auVar52,_DAT_009d86b0,ZEXT416((uint)fVar33));
          auVar6 = vfmsub231ss_fma(ZEXT416((uint)(local_188.m_floats[0] * auVar52._0_4_)),
                                   ZEXT416((uint)fVar33),auVar44);
          auVar58._0_4_ = local_188.m_floats[1] * auVar24._0_4_;
          auVar58._4_4_ = local_188.m_floats[2] * auVar24._4_4_;
          auVar58._8_4_ = auVar24._8_4_ * 0.0;
          auVar58._12_4_ = auVar24._12_4_ * 0.0;
          auVar25 = vpermt2ps_avx512vl(auVar44,_DAT_009d86b0,ZEXT416((uint)local_188.m_floats[0]));
          auVar27 = vfmsub213ps_fma(auVar25,auVar52,auVar58);
          fVar28 = auVar27._0_4_;
          auVar56._0_4_ = fVar28 * fVar28;
          fVar49 = auVar27._4_4_;
          auVar56._4_4_ = fVar49 * fVar49;
          fVar61 = auVar27._8_4_;
          auVar56._8_4_ = fVar61 * fVar61;
          fVar5 = auVar27._12_4_;
          auVar56._12_4_ = fVar5 * fVar5;
          auVar25 = vmovshdup_avx(auVar56);
          auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
          auVar25 = vfmadd231ss_fma(auVar25,auVar6,auVar6);
          auVar25 = vsqrtss_avx(auVar25,auVar25);
          fVar55 = 1.0 / auVar25._0_4_;
          fVar50 = auVar6._0_4_ * fVar55;
          auVar45._0_4_ = fVar55 * fVar28;
          auVar45._4_4_ = fVar55 * fVar49;
          auVar45._8_4_ = fVar55 * fVar61;
          auVar45._12_4_ = fVar55 * fVar5;
          auVar25 = vmovshdup_avx(auVar45);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)((pcVar3[iVar15].m_floats[1] -
                                                   pcVar3[iVar20].m_floats[1]) * auVar25._0_4_)),
                                    auVar45,ZEXT416((uint)(pcVar3[iVar15].m_floats[0] -
                                                          pcVar3[iVar20].m_floats[0])));
          auVar6._8_8_ = 0;
          auVar6._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
          auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar50),
                                    ZEXT416((uint)(pcVar3[iVar15].m_floats[2] -
                                                  pcVar3[iVar20].m_floats[2])));
          if (auVar25._0_4_ < 0.0) {
            uVar13 = CONCAT44(auVar45._4_4_,auVar45._0_4_);
            auVar45._0_8_ = uVar13 ^ 0x8000000080000000;
            auVar45._8_4_ = -auVar45._8_4_;
            auVar45._12_4_ = -auVar45._12_4_;
            fVar50 = -fVar50;
          }
          auVar62._4_4_ = local_1c8.m_floats[2];
          auVar62._0_4_ = local_1c8.m_floats[1];
          auVar62._8_8_ = 0;
          auVar57 = SUB1612(auVar6 << 0x40,4);
          auVar51._4_12_ = auVar57;
          auVar51._0_4_ = fVar50;
          auVar54._0_4_ = local_1c8.m_floats[1] * auVar24._0_4_;
          auVar54._4_4_ = local_1c8.m_floats[2] * auVar24._4_4_;
          auVar54._8_4_ = auVar24._8_4_ * 0.0;
          auVar54._12_4_ = auVar24._12_4_ * 0.0;
          auVar25 = vpermi2ps_avx512vl(_DAT_009d86b0,auVar62,ZEXT416((uint)local_1c8.m_floats[0]));
          auVar27 = vfmsub213ps_fma(auVar25,auVar52,auVar54);
          auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar33),auVar62,
                                   ZEXT416((uint)(local_1c8.m_floats[0] * auVar52._0_4_)));
          fVar28 = auVar27._0_4_;
          auVar53._0_4_ = fVar28 * fVar28;
          fVar49 = auVar27._4_4_;
          auVar53._4_4_ = fVar49 * fVar49;
          fVar61 = auVar27._8_4_;
          auVar53._8_4_ = fVar61 * fVar61;
          fVar5 = auVar27._12_4_;
          auVar53._12_4_ = fVar5 * fVar5;
          auVar25 = vmovshdup_avx(auVar53);
          auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
          auVar25 = vfmadd231ss_fma(auVar25,auVar6,auVar6);
          auVar25 = vsqrtss_avx(auVar25,auVar25);
          fVar55 = 1.0 / auVar25._0_4_;
          fVar33 = auVar6._0_4_ * fVar55;
          auVar60._0_4_ = fVar28 * fVar55;
          auVar60._4_4_ = fVar49 * fVar55;
          auVar60._8_4_ = fVar61 * fVar55;
          auVar60._12_4_ = fVar5 * fVar55;
          auVar25 = vmovshdup_avx(auVar60);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ *
                                                  (pcVar22->m_floats[1] - pcVar23->m_floats[1]))),
                                    auVar60,ZEXT416((uint)(pcVar22->m_floats[0] -
                                                          pcVar23->m_floats[0])));
          auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar33),
                                    ZEXT416((uint)(pcVar22->m_floats[2] - pcVar23->m_floats[2])));
          if (auVar25._0_4_ < 0.0) {
            uVar13 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
            auVar60._0_8_ = uVar13 ^ 0x8000000080000000;
            auVar60._8_4_ = -auVar60._8_4_;
            auVar60._12_4_ = -auVar60._12_4_;
            fVar33 = -fVar33;
          }
          auVar59._4_12_ = auVar57;
          auVar59._0_4_ = fVar33;
          auVar25 = vmovshdup_avx(auVar60);
          auVar27 = vmovshdup_avx(auVar45);
          fVar61 = auVar25._0_4_;
          fVar28 = auVar27._0_4_;
          auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * auVar45._0_4_)),auVar51,auVar60);
          auVar24 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar50)),auVar27,auVar59);
          auVar7 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar28)),auVar45,auVar25);
          fVar49 = auVar6._0_4_;
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),auVar24,auVar24);
          auVar25 = vfmadd231ss_fma(auVar25,auVar7,auVar7);
          if (this->m_triangleInfoMap->m_planarEpsilon <= auVar25._0_4_) {
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            fVar55 = 1.0 / auVar25._0_4_;
            fVar5 = auVar24._0_4_ * fVar55;
            fVar33 = auVar7._0_4_ * fVar55;
            auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar50 * fVar5)),auVar45,ZEXT416((uint)fVar33))
            ;
            auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * fVar33)),
                                      ZEXT416((uint)(fVar49 * fVar55)),auVar51);
            auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar49 * fVar55)),auVar27,
                                      ZEXT416((uint)fVar5));
            fVar49 = auVar25._0_4_;
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar28)),auVar60,auVar45);
            auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),auVar26,auVar26);
            auVar6 = vfmadd231ss_fma(auVar25,auVar59,auVar51);
            auVar25 = vfmadd231ss_fma(auVar27,auVar24,auVar24);
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            fVar28 = 1.0 / auVar25._0_4_;
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar49 * fVar28)),auVar60,
                                      ZEXT416((uint)(auVar26._0_4_ * fVar28)));
            auVar25 = vfmadd231ss_fma(auVar25,auVar59,ZEXT416((uint)(auVar24._0_4_ * fVar28)));
            local_1b8 = auVar59;
            fVar28 = atan2f(auVar25._0_4_,auVar6._0_4_);
            auVar11._8_4_ = 0x80000000;
            auVar11._0_8_ = 0x8000000080000000;
            auVar11._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(ZEXT416((uint)(3.1415927 - fVar28)),auVar11);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * local_188.m_floats[1])),auVar60,
                                      ZEXT416((uint)local_188.m_floats[0]));
            auVar25 = vfmadd231ss_fma(auVar25,local_1b8,ZEXT416((uint)local_188.m_floats[2]));
            bVar12 = auVar25._0_4_ < 0.0;
            auVar26._4_12_ = auVar27._4_12_;
            auVar26._0_4_ = (uint)bVar12 * (int)(3.1415927 - fVar28) + (uint)!bVar12 * auVar27._0_4_
            ;
          }
          else {
            bVar12 = false;
          }
          fVar28 = auVar26._0_4_;
          if (iVar17 == 3) {
            pcVar3 = this->m_triangleVerticesA;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)pcVar3[1].m_floats;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)pcVar3[2].m_floats;
            fVar50 = pcVar3[1].m_floats[2] - pcVar3[2].m_floats[2];
            auVar27 = vsubps_avx(auVar48,auVar38);
            fVar49 = auVar27._0_4_;
            auVar39._0_4_ = fVar49 * fVar49;
            fVar61 = auVar27._4_4_;
            auVar39._4_4_ = fVar61 * fVar61;
            fVar5 = auVar27._8_4_;
            auVar39._8_4_ = fVar5 * fVar5;
            fVar33 = auVar27._12_4_;
            auVar39._12_4_ = fVar33 * fVar33;
            auVar25 = vmovshdup_avx(auVar39);
            auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            local_178 = auVar25._0_4_;
            local_1b8 = auVar26;
            fVar55 = sinf(fVar28 * -0.5);
            fVar55 = fVar55 / local_178;
            local_1d8._4_4_ = fVar55 * fVar61;
            local_1d8._0_4_ = fVar55 * fVar49;
            fStack_1d0 = fVar55 * fVar5;
            fStack_1cc = fVar55 * fVar33;
            local_158.super_cbtQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
            local_158.super_cbtQuadWord.m_floats._0_8_ = vmovlps_avx(_local_1d8);
            auVar43 = (undefined1  [56])0x0;
            auVar32 = extraout_var_01;
            local_158.super_cbtQuadWord.m_floats[2] = fVar55 * fVar50;
            cVar63 = quatRotate(&local_158,&local_188);
            auVar42._0_8_ = cVar63.m_floats._8_8_;
            auVar42._8_56_ = auVar43;
            auVar31._0_8_ = cVar63.m_floats._0_8_;
            auVar31._8_56_ = auVar32;
            auVar25 = vmovshdup_avx(auVar31._0_16_);
            auVar10._8_4_ = 0x80000000;
            auVar10._0_8_ = 0x8000000080000000;
            auVar10._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(local_1b8,auVar10);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_1c8.m_floats[1])),
                                      auVar31._0_16_,ZEXT416((uint)local_1c8.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar42._0_16_,auVar25,ZEXT416((uint)local_1c8.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 0x10;
            }
            local_1a0->m_edgeV1V2Angle = auVar27._0_4_;
            if (bVar12) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 2;
            }
          }
          else if (iVar17 == 2) {
            pcVar3 = this->m_triangleVerticesA;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)pcVar3->m_floats;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)pcVar3[2].m_floats;
            fVar50 = pcVar3[2].m_floats[2] - pcVar3->m_floats[2];
            auVar27 = vsubps_avx(auVar36,auVar47);
            fVar49 = auVar27._0_4_;
            auVar37._0_4_ = fVar49 * fVar49;
            fVar61 = auVar27._4_4_;
            auVar37._4_4_ = fVar61 * fVar61;
            fVar5 = auVar27._8_4_;
            auVar37._8_4_ = fVar5 * fVar5;
            fVar33 = auVar27._12_4_;
            auVar37._12_4_ = fVar33 * fVar33;
            auVar25 = vmovshdup_avx(auVar37);
            auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            local_178 = auVar25._0_4_;
            local_1b8 = auVar26;
            fVar55 = sinf(fVar28 * -0.5);
            fVar55 = fVar55 / local_178;
            local_1d8._4_4_ = fVar55 * fVar61;
            local_1d8._0_4_ = fVar55 * fVar49;
            fStack_1d0 = fVar55 * fVar5;
            fStack_1cc = fVar55 * fVar33;
            local_158.super_cbtQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
            local_158.super_cbtQuadWord.m_floats._0_8_ = vmovlps_avx(_local_1d8);
            auVar43 = (undefined1  [56])0x0;
            auVar32 = extraout_var_00;
            local_158.super_cbtQuadWord.m_floats[2] = fVar55 * fVar50;
            cVar63 = quatRotate(&local_158,&local_188);
            auVar41._0_8_ = cVar63.m_floats._8_8_;
            auVar41._8_56_ = auVar43;
            auVar30._0_8_ = cVar63.m_floats._0_8_;
            auVar30._8_56_ = auVar32;
            auVar25 = vmovshdup_avx(auVar30._0_16_);
            auVar9._8_4_ = 0x80000000;
            auVar9._0_8_ = 0x8000000080000000;
            auVar9._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(local_1b8,auVar9);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_1c8.m_floats[1])),
                                      auVar30._0_16_,ZEXT416((uint)local_1c8.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar41._0_16_,auVar25,ZEXT416((uint)local_1c8.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 0x20;
            }
            local_1a0->m_edgeV2V0Angle = auVar27._0_4_;
            if (bVar12) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 4;
            }
          }
          else if (iVar17 == 1) {
            pcVar3 = this->m_triangleVerticesA;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)pcVar3->m_floats;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)pcVar3[1].m_floats;
            fVar50 = pcVar3->m_floats[2] - pcVar3[1].m_floats[2];
            auVar27 = vsubps_avx(auVar46,auVar34);
            fVar49 = auVar27._0_4_;
            auVar35._0_4_ = fVar49 * fVar49;
            fVar61 = auVar27._4_4_;
            auVar35._4_4_ = fVar61 * fVar61;
            fVar5 = auVar27._8_4_;
            auVar35._8_4_ = fVar5 * fVar5;
            fVar33 = auVar27._12_4_;
            auVar35._12_4_ = fVar33 * fVar33;
            auVar25 = vmovshdup_avx(auVar35);
            auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            local_178 = auVar25._0_4_;
            local_1b8 = auVar26;
            fVar55 = sinf(fVar28 * -0.5);
            fVar55 = fVar55 / local_178;
            local_1d8._4_4_ = fVar55 * fVar61;
            local_1d8._0_4_ = fVar55 * fVar49;
            fStack_1d0 = fVar55 * fVar5;
            fStack_1cc = fVar55 * fVar33;
            local_158.super_cbtQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
            local_158.super_cbtQuadWord.m_floats._0_8_ = vmovlps_avx(_local_1d8);
            auVar43 = (undefined1  [56])0x0;
            auVar32 = extraout_var;
            local_158.super_cbtQuadWord.m_floats[2] = fVar55 * fVar50;
            cVar63 = quatRotate(&local_158,&local_188);
            auVar40._0_8_ = cVar63.m_floats._8_8_;
            auVar40._8_56_ = auVar43;
            auVar29._0_8_ = cVar63.m_floats._0_8_;
            auVar29._8_56_ = auVar32;
            auVar25 = vmovshdup_avx(auVar29._0_16_);
            auVar8._8_4_ = 0x80000000;
            auVar8._0_8_ = 0x8000000080000000;
            auVar8._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(local_1b8,auVar8);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_1c8.m_floats[1])),
                                      auVar29._0_16_,ZEXT416((uint)local_1c8.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar40._0_16_,auVar25,ZEXT416((uint)local_1c8.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 8;
            }
            local_1a0->m_edgeV0V1Angle = auVar27._0_4_;
            if (bVar12) {
              *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 1;
            }
          }
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape
                    (&local_130.super_cbtPolyhedralConvexShape);
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape((cbtPolyhedralConvexShape *)local_b0);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3] = {-1, -1, -1};
		int sharedVertsB[3] = {-1, -1, -1};

		///skip degenerate triangles
		cbtScalar crossBSqr = ((triangle[1] - triangle[0]).cross(triangle[2] - triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

		cbtScalar crossASqr = ((m_triangleVerticesA[1] - m_triangleVerticesA[0]).cross(m_triangleVerticesA[2] - m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i = 0; i < 3; i++)
		{
			for (int j = 0; j < 3; j++)
			{
				if ((m_triangleVerticesA[i] - triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if (numshared >= 3)
						return;
				}
			}
			///degenerate case
			if (numshared >= 3)
				return;
		}
		switch (numshared)
		{
			case 0:
			{
				break;
			}
			case 1:
			{
				//shared vertex
				break;
			}
			case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = cbtGetHash(m_partIdA, m_triangleIndexA);

				cbtTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					cbtTriangleInfo tmp;
					m_triangleInfoMap->insert(hash, tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0] + sharedVertsA[1];
				int otherIndexA = 3 - sumvertsA;

				cbtVector3 edge(m_triangleVerticesA[sharedVertsA[1]] - m_triangleVerticesA[sharedVertsA[0]]);

				cbtTriangleShape tA(m_triangleVerticesA[0], m_triangleVerticesA[1], m_triangleVerticesA[2]);
				int otherIndexB = 3 - (sharedVertsB[0] + sharedVertsB[1]);

				cbtTriangleShape tB(triangle[sharedVertsB[1]], triangle[sharedVertsB[0]], triangle[otherIndexB]);
				//cbtTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				cbtVector3 normalA;
				cbtVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				cbtVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					cbtVector3 tmp = m_triangleVerticesA[otherIndexA] - m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA *= -1;
					}
				}

				cbtVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					cbtVector3 tmp = triangle[otherIndexB] - triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB *= -1;
					}
				}

				cbtScalar angle2 = 0;
				cbtScalar ang4 = 0.f;

				cbtVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				cbtScalar len2 = calculatedEdge.length2();

				cbtScalar correctedAngle(0);
				//cbtVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2 < m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				}
				else
				{
					calculatedEdge.normalize();
					cbtVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = cbtGetAngle(calculatedNormalA, edgeCrossA, edgeCrossB);
					ang4 = SIMD_PI - angle2;
					cbtScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA < 0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				//alternatively use
				//cbtVector3 calculatedNormalB2 = quatRotate(orn,normalA);

				switch (sumvertsA)
				{
					case 1:
					{
						cbtVector3 edge = m_triangleVerticesA[0] - m_triangleVerticesA[1];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						cbtScalar bla = computedNormalB.dot(normalB);
						if (bla < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
					case 2:
					{
						cbtVector3 edge = m_triangleVerticesA[2] - m_triangleVerticesA[0];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;
					}
					case 3:
					{
						cbtVector3 edge = m_triangleVerticesA[1] - m_triangleVerticesA[2];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB *= -1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
			default:
			{
				//				printf("warning: duplicate triangle\n");
			}
		}
	}